

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvOpcodeMemorySemanticsOperandIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Op opcode)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  allocator<unsigned_int> local_79;
  uint local_78 [2];
  iterator local_70;
  size_type local_68;
  allocator<unsigned_int> local_5d;
  uint local_5c;
  iterator local_58;
  size_type local_50;
  allocator<unsigned_int> local_45;
  uint local_44;
  iterator local_40;
  size_type local_38;
  allocator<unsigned_int> local_2d;
  uint local_2c;
  iterator local_28;
  size_type local_20;
  Op local_14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_10;
  Op opcode_local;
  
  local_14 = opcode;
  pvStack_10 = __return_storage_ptr__;
  if (opcode == OpControlBarrier) {
LAB_0038d3ea:
    local_44 = 2;
    local_40 = &local_44;
    local_38 = 1;
    std::allocator<unsigned_int>::allocator(&local_45);
    __l_01._M_len = local_38;
    __l_01._M_array = local_40;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,__l_01,&local_45);
    std::allocator<unsigned_int>::~allocator(&local_45);
  }
  else {
    if (opcode == OpMemoryBarrier) {
      local_2c = 1;
      local_28 = &local_2c;
      local_20 = 1;
      std::allocator<unsigned_int>::allocator(&local_2d);
      __l_02._M_len = local_20;
      __l_02._M_array = local_28;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (__return_storage_ptr__,__l_02,&local_2d);
      std::allocator<unsigned_int>::~allocator(&local_2d);
      return __return_storage_ptr__;
    }
    if (opcode != OpAtomicLoad) {
      if (opcode == OpAtomicStore) goto LAB_0038d3ea;
      if (opcode != OpAtomicExchange) {
        if (opcode - OpAtomicCompareExchange < 2) {
          local_78[0] = 4;
          local_78[1] = 5;
          local_70 = local_78;
          local_68 = 2;
          std::allocator<unsigned_int>::allocator(&local_79);
          __l._M_len = local_68;
          __l._M_array = local_70;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (__return_storage_ptr__,__l,&local_79);
          std::allocator<unsigned_int>::~allocator(&local_79);
          return __return_storage_ptr__;
        }
        if ((10 < opcode - OpAtomicIIncrement) && (opcode != OpAtomicFlagTestAndSet)) {
          if ((opcode == OpAtomicFlagClear) || (opcode == OpMemoryNamedBarrier)) goto LAB_0038d3ea;
          if (opcode != OpAtomicFAddEXT) {
            memset(__return_storage_ptr__,0,0x18);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__)
            ;
            return __return_storage_ptr__;
          }
        }
      }
    }
    local_5c = 4;
    local_58 = &local_5c;
    local_50 = 1;
    std::allocator<unsigned_int>::allocator(&local_5d);
    __l_00._M_len = local_50;
    __l_00._M_array = local_58;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,__l_00,&local_5d);
    std::allocator<unsigned_int>::~allocator(&local_5d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> spvOpcodeMemorySemanticsOperandIndices(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpMemoryBarrier:
      return {1};
    case spv::Op::OpAtomicStore:
    case spv::Op::OpControlBarrier:
    case spv::Op::OpAtomicFlagClear:
    case spv::Op::OpMemoryNamedBarrier:
      return {2};
    case spv::Op::OpAtomicLoad:
    case spv::Op::OpAtomicExchange:
    case spv::Op::OpAtomicIIncrement:
    case spv::Op::OpAtomicIDecrement:
    case spv::Op::OpAtomicIAdd:
    case spv::Op::OpAtomicFAddEXT:
    case spv::Op::OpAtomicISub:
    case spv::Op::OpAtomicSMin:
    case spv::Op::OpAtomicUMin:
    case spv::Op::OpAtomicSMax:
    case spv::Op::OpAtomicUMax:
    case spv::Op::OpAtomicAnd:
    case spv::Op::OpAtomicOr:
    case spv::Op::OpAtomicXor:
    case spv::Op::OpAtomicFlagTestAndSet:
      return {4};
    case spv::Op::OpAtomicCompareExchange:
    case spv::Op::OpAtomicCompareExchangeWeak:
      return {4, 5};
    default:
      return {};
  }
}